

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bluetooth_piconet.c
# Opt level: O2

btbb_piconet * get_piconet(uint32_t lap)

{
  long *plVar1;
  UT_hash_bucket *pUVar2;
  UT_hash_handle *pUVar3;
  UT_hash_table *pUVar4;
  UT_hash_bucket *__ptr;
  UT_hash_handle *pUVar5;
  UT_hash_handle *pUVar6;
  btbb_piconet *pbVar7;
  survey_hash *psVar8;
  UT_hash_table *pUVar9;
  survey_hash *psVar10;
  UT_hash_bucket *pUVar11;
  uint uVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  UT_hash_handle *pUVar19;
  uint uVar20;
  uchar *_hj_key;
  uint32_t lap_local;
  
  if (piconet_survey != (survey_hash *)0x0) {
    uVar17 = lap + 0x112410d ^ 0x7f76d;
    uVar12 = uVar17 << 8 ^ 0x9f49bac6 - uVar17;
    uVar14 = uVar12 >> 0xd ^ (-0x112410d - uVar17) - uVar12;
    uVar17 = uVar14 >> 0xc ^ (uVar17 - uVar12) - uVar14;
    uVar18 = uVar17 << 0x10 ^ (uVar12 - uVar14) - uVar17;
    uVar12 = uVar18 >> 5 ^ (uVar14 - uVar17) - uVar18;
    uVar14 = uVar12 >> 3 ^ (uVar17 - uVar18) - uVar12;
    uVar17 = uVar14 << 10 ^ (uVar18 - uVar12) - uVar14;
    pUVar9 = (piconet_survey->hh).tbl;
    pUVar3 = pUVar9->buckets[pUVar9->num_buckets - 1 & (uVar17 >> 0xf ^ uVar12 - (uVar14 + uVar17))]
             .hh_head;
    if (pUVar3 == (UT_hash_handle *)0x0) {
      lVar13 = 0;
    }
    else {
      lVar13 = (long)pUVar3 - pUVar9->hho;
    }
    while (lVar13 != 0) {
      if ((*(int *)(lVar13 + 0x40) == 4) && (**(uint32_t **)(lVar13 + 0x38) == lap)) {
        return *(btbb_piconet **)(lVar13 + 8);
      }
      plVar1 = (long *)(lVar13 + 0x30);
      lVar13 = 0;
      if (*plVar1 != 0) {
        lVar13 = *plVar1 - pUVar9->hho;
      }
    }
  }
  pbVar7 = btbb_piconet_new();
  pbVar7->LAP = lap;
  *(byte *)&pbVar7->flags = (byte)pbVar7->flags | 8;
  psVar8 = (survey_hash *)malloc(0x48);
  psVar8->key = lap;
  psVar8->pn = pbVar7;
  pUVar3 = &psVar8->hh;
  (psVar8->hh).next = (void *)0x0;
  (psVar8->hh).key = psVar8;
  (psVar8->hh).keylen = 4;
  psVar10 = piconet_survey;
  if (piconet_survey == (survey_hash *)0x0) {
    piconet_survey = psVar8;
    (psVar8->hh).prev = (void *)0x0;
    pUVar9 = (UT_hash_table *)calloc(1,0x40);
    (psVar8->hh).tbl = pUVar9;
    if (pUVar9 == (UT_hash_table *)0x0) goto LAB_001064e0;
    pUVar9->tail = pUVar3;
    pUVar9->num_buckets = 0x20;
    pUVar9->log2_num_buckets = 5;
    pUVar9->hho = 0x10;
    pUVar11 = (UT_hash_bucket *)calloc(1,0x200);
    pUVar9->buckets = pUVar11;
    if (pUVar11 == (UT_hash_bucket *)0x0) goto LAB_001064e0;
    pUVar9->signature = 0xa0111fe1;
    psVar10 = psVar8;
  }
  else {
    pUVar9 = (piconet_survey->hh).tbl;
    pUVar19 = pUVar9->tail;
    pUVar19->next = psVar8;
    (psVar8->hh).prev = (void *)((long)pUVar19 - pUVar9->hho);
    pUVar9->tail = pUVar3;
  }
  uVar20 = pUVar9->num_items + 1;
  pUVar9->num_items = uVar20;
  (psVar8->hh).tbl = pUVar9;
  uVar14 = psVar8->key + 0x112410d ^ 0x7f76d;
  uVar12 = uVar14 << 8 ^ 0x9f49bac6 - uVar14;
  uVar17 = uVar12 >> 0xd ^ (-0x112410d - uVar14) - uVar12;
  uVar18 = uVar17 >> 0xc ^ (uVar14 - uVar12) - uVar17;
  uVar14 = uVar18 << 0x10 ^ (uVar12 - uVar17) - uVar18;
  uVar12 = uVar14 >> 5 ^ (uVar17 - uVar18) - uVar14;
  uVar17 = uVar12 >> 3 ^ (uVar18 - uVar14) - uVar12;
  uVar14 = uVar17 << 10 ^ (uVar14 - uVar12) - uVar17;
  uVar14 = uVar14 >> 0xf ^ uVar12 - (uVar17 + uVar14);
  (psVar8->hh).hashv = uVar14;
  pUVar4 = (psVar10->hh).tbl;
  uVar14 = pUVar4->num_buckets - 1 & uVar14;
  pUVar11 = pUVar4->buckets;
  uVar12 = pUVar11[uVar14].count + 1;
  pUVar11[uVar14].count = uVar12;
  pUVar19 = pUVar11[uVar14].hh_head;
  (psVar8->hh).hh_next = pUVar19;
  (psVar8->hh).hh_prev = (UT_hash_handle *)0x0;
  if (pUVar19 != (UT_hash_handle *)0x0) {
    pUVar19->hh_prev = pUVar3;
  }
  pUVar11[uVar14].hh_head = pUVar3;
  if ((pUVar11[uVar14].expand_mult * 10 + 10 <= uVar12) && (pUVar9->noexpand != 1)) {
    uVar12 = pUVar9->num_buckets;
    uVar14 = uVar12 * 2;
    pUVar11 = (UT_hash_bucket *)calloc(1,(ulong)uVar14 << 4);
    if (pUVar11 == (UT_hash_bucket *)0x0) {
LAB_001064e0:
      exit(-1);
    }
    uVar14 = uVar14 - 1;
    uVar18 = ((uVar20 >> ((char)pUVar9->log2_num_buckets + 1U & 0x1f)) + 1) -
             (uint)((uVar14 & uVar20) == 0);
    pUVar9->ideal_chain_maxlen = uVar18;
    pUVar9->nonideal_items = 0;
    __ptr = pUVar9->buckets;
    uVar17 = 0;
    for (uVar16 = 0; uVar16 != uVar12; uVar16 = uVar16 + 1) {
      pUVar19 = __ptr[uVar16].hh_head;
      while (pUVar19 != (UT_hash_handle *)0x0) {
        pUVar5 = pUVar19->hh_next;
        uVar15 = pUVar19->hashv & uVar14;
        pUVar2 = pUVar11 + uVar15;
        uVar20 = pUVar11[uVar15].count + 1;
        pUVar11[uVar15].count = uVar20;
        if (uVar18 < uVar20) {
          uVar17 = uVar17 + 1;
          pUVar9->nonideal_items = uVar17;
          pUVar2->expand_mult = uVar20 / uVar18;
        }
        pUVar19->hh_prev = (UT_hash_handle *)0x0;
        pUVar6 = pUVar2->hh_head;
        pUVar19->hh_next = pUVar6;
        if (pUVar6 != (UT_hash_handle *)0x0) {
          pUVar6->hh_prev = pUVar19;
        }
        pUVar2->hh_head = pUVar19;
        pUVar19 = pUVar5;
      }
    }
    free(__ptr);
    pUVar9 = pUVar3->tbl;
    pUVar9->num_buckets = pUVar9->num_buckets << 1;
    pUVar9->log2_num_buckets = pUVar9->log2_num_buckets + 1;
    pUVar9->buckets = pUVar11;
    if (pUVar9->num_items >> 1 < pUVar9->nonideal_items) {
      uVar12 = pUVar9->ineff_expands + 1;
      pUVar9->ineff_expands = uVar12;
      if (1 < uVar12) {
        pUVar9->noexpand = 1;
      }
    }
    else {
      pUVar9->ineff_expands = 0;
    }
  }
  return pbVar7;
}

Assistant:

btbb_piconet *get_piconet(uint32_t lap)
{
	survey_hash *s;
	btbb_piconet *pn;
	HASH_FIND(hh, piconet_survey, &lap, 4, s);

	if (s == NULL) {
		pn = btbb_piconet_new();
		btbb_init_piconet(pn, lap);

		s = malloc(sizeof(survey_hash));
		s->key = lap;
		s->pn = pn;
		HASH_ADD(hh, piconet_survey, key, 4, s);
	} else {
		pn = s->pn;
	}
	return pn;
}